

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,ExtensionInfo *extension,CodedInputStream *input,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  int64 iVar4;
  ulong uVar5;
  LogMessage *other;
  float fVar6;
  double dVar7;
  MessageLite *local_470;
  MessageLite *local_468;
  string *local_460;
  string *local_458;
  MessageLite *value_31;
  MessageLite *value_30;
  string *value_29;
  string *value_28;
  int value_27;
  bool value_26;
  double value_25;
  int64 iStack_3f0;
  float value_24;
  int64 value_23;
  uint64 uStack_3e0;
  int32 value_22;
  uint64 value_21;
  int64 iStack_3d0;
  uint32 value_20;
  int64 value_19;
  uint64 uStack_3c0;
  int32 value_18;
  uint64 value_17;
  int64 iStack_3b0;
  uint32 value_16;
  int64 value_15;
  LogFinisher local_39d;
  int32 value_14;
  LogMessage local_390;
  uint32 local_358;
  byte local_351;
  int value_13;
  bool value_12;
  double value_11;
  int64 iStack_340;
  float value_10;
  int64 value_9;
  uint64 uStack_330;
  int32 value_8;
  uint64 value_7;
  int64 iStack_320;
  uint32 value_6;
  int64 value_5;
  uint64 uStack_310;
  int32 value_4;
  uint64 value_3;
  int64 iStack_300;
  uint32 value_2;
  int64 value_1;
  Limit local_2f0;
  int32 value;
  Limit limit;
  uint32 size;
  FieldSkipper *field_skipper_local;
  CodedInputStream *input_local;
  ExtensionInfo *extension_local;
  ExtensionSet *pEStack_2c8;
  int number_local;
  ExtensionSet *this_local;
  undefined4 *puStack_2b8;
  uint32 temp_10;
  CodedInputStream *local_2b0;
  undefined1 local_2a5;
  uint32 local_2a4;
  uint32 *puStack_2a0;
  uint32 temp;
  FieldSkipper *local_298;
  undefined1 local_289;
  uint64 local_288;
  uint64 temp_11;
  CodedInputStream *local_278;
  undefined1 local_269;
  uint64 local_268;
  uint64 temp_1;
  FieldSkipper *local_258;
  undefined1 local_249;
  uint32 *local_248;
  CodedInputStream *local_240;
  uint32 *local_238;
  FieldSkipper *local_230;
  uint64 *local_228;
  CodedInputStream *local_220;
  uint64 *local_218;
  FieldSkipper *local_210;
  uint32 local_204;
  int32 *piStack_200;
  uint32 temp_12;
  CodedInputStream *local_1f8;
  undefined1 local_1ed;
  uint32 local_1ec;
  int32 *piStack_1e8;
  uint32 temp_2;
  FieldSkipper *local_1e0;
  undefined1 local_1d1;
  uint64 local_1d0;
  uint64 temp_13;
  CodedInputStream *local_1c0;
  undefined1 local_1b1;
  uint64 local_1b0;
  uint64 temp_3;
  FieldSkipper *local_1a0;
  undefined1 local_191;
  uint32 *local_190;
  CodedInputStream *local_188;
  uint32 *local_180;
  FieldSkipper *local_178;
  uint64 *local_170;
  CodedInputStream *local_168;
  uint64 *local_160;
  FieldSkipper *local_158;
  uint32 local_14c;
  uint32 *puStack_148;
  uint32 temp_14;
  CodedInputStream *local_140;
  undefined1 local_135;
  uint32 local_134;
  uint32 *puStack_130;
  uint32 temp_4;
  FieldSkipper *local_128;
  undefined1 local_119;
  uint64 local_118;
  uint64 temp_15;
  CodedInputStream *local_108;
  undefined1 local_f9;
  uint64 local_f8;
  uint64 temp_5;
  FieldSkipper *local_e8;
  undefined1 local_dd;
  uint32 local_dc;
  float *pfStack_d8;
  uint32 temp_16;
  CodedInputStream *local_d0;
  undefined1 local_c5;
  uint32 local_c4;
  float *pfStack_c0;
  uint32 temp_6;
  FieldSkipper *local_b8;
  undefined1 local_a9;
  uint64 local_a8;
  uint64 temp_17;
  CodedInputStream *local_98;
  undefined1 local_89;
  uint64 local_88;
  uint64 temp_7;
  FieldSkipper *local_78;
  undefined1 local_6d;
  uint32 local_6c;
  long lStack_68;
  uint32 temp_18;
  CodedInputStream *local_60;
  undefined1 local_55;
  uint32 local_54;
  byte *pbStack_50;
  uint32 temp_8;
  FieldSkipper *local_48;
  undefined1 local_3d;
  uint32 local_3c;
  string **ppsStack_38;
  uint32 temp_19;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp_9;
  FieldSkipper *local_18;
  undefined1 local_9;
  
  _limit = field_skipper;
  field_skipper_local = (FieldSkipper *)input;
  input_local = (CodedInputStream *)extension;
  extension_local._4_4_ = number;
  pEStack_2c8 = this;
  if ((extension->is_packed & 1U) == 0) {
    switch(extension->type) {
    case '\x01':
      temp_17 = (uint64)&value_27;
      local_98 = input;
      local_89 = io::CodedInputStream::ReadLittleEndian64(input,&local_a8);
      if (!(bool)local_89) {
        return false;
      }
      dVar7 = WireFormatLite::DecodeDouble(local_a8);
      *(double *)temp_17 = dVar7;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetDouble(this,extension_local._4_4_,'\x01',_value_27,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddDouble(this,extension_local._4_4_,'\x01',false,_value_27,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x02':
      pfStack_d8 = (float *)((long)&value_25 + 4);
      local_d0 = input;
      local_c5 = io::CodedInputStream::ReadLittleEndian32(input,&local_dc);
      if (!(bool)local_c5) {
        return false;
      }
      fVar6 = WireFormatLite::DecodeFloat(local_dc);
      *pfStack_d8 = fVar6;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetFloat(this,extension_local._4_4_,'\x02',value_25._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddFloat(this,extension_local._4_4_,'\x02',false,value_25._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x03':
      temp_11 = (uint64)&stack0xfffffffffffffc50;
      local_278 = input;
      local_269 = io::CodedInputStream::ReadVarint64(input,&local_288);
      if (!(bool)local_269) {
        return false;
      }
      *(uint64 *)temp_11 = local_288;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt64(this,extension_local._4_4_,'\x03',iStack_3b0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x03',false,iStack_3b0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x04':
      local_228 = &stack0xfffffffffffffc40;
      local_220 = input;
      bVar1 = io::CodedInputStream::ReadVarint64(input,local_228);
      if (!bVar1) {
        return false;
      }
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x04',uStack_3c0,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x04',false,uStack_3c0,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x05':
      puStack_2b8 = (undefined4 *)((long)&value_15 + 4);
      local_2b0 = input;
      local_2a5 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&this_local + 4));
      if (!(bool)local_2a5) {
        return false;
      }
      *puStack_2b8 = this_local._4_4_;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt32(this,extension_local._4_4_,'\x05',value_15._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x05',false,value_15._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x06':
      local_170 = &stack0xfffffffffffffc20;
      local_168 = input;
      bVar1 = io::CodedInputStream::ReadLittleEndian64(input,local_170);
      if (!bVar1) {
        return false;
      }
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x06',uStack_3e0,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x06',false,uStack_3e0,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\a':
      local_190 = (uint32 *)((long)&value_21 + 4);
      local_188 = input;
      bVar1 = io::CodedInputStream::ReadLittleEndian32(input,local_190);
      if (!bVar1) {
        return false;
      }
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetUInt32(this,extension_local._4_4_,'\a',value_21._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\a',false,value_21._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\b':
      lStack_68 = (long)&value_28 + 7;
      local_60 = input;
      local_55 = io::CodedInputStream::ReadVarint32(input,&local_6c);
      if (!(bool)local_55) {
        return false;
      }
      *(bool *)lStack_68 = local_6c != 0;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetBool(this,extension_local._4_4_,'\b',(bool)(value_28._7_1_ & 1),
                *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddBool(this,extension_local._4_4_,'\b',false,(bool)(value_28._7_1_ & 1),
                *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\t':
      if ((extension->is_repeated & 1U) == 0) {
        local_458 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      else {
        local_458 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      bVar1 = WireFormatLite::ReadString((CodedInputStream *)field_skipper_local,local_458);
      if (!bVar1) {
        return false;
      }
      break;
    case '\n':
      if ((extension->is_repeated & 1U) == 0) {
        local_468 = MutableMessage(this,number,'\n',(extension->field_3).message_prototype,
                                   extension->descriptor);
      }
      else {
        local_468 = AddMessage(this,number,'\n',(extension->field_3).message_prototype,
                               extension->descriptor);
      }
      bVar1 = WireFormatLite::ReadGroup
                        (extension_local._4_4_,(CodedInputStream *)field_skipper_local,local_468);
      if (!bVar1) {
        return false;
      }
      break;
    case '\v':
      if ((extension->is_repeated & 1U) == 0) {
        local_470 = MutableMessage(this,number,'\v',(extension->field_3).message_prototype,
                                   extension->descriptor);
      }
      else {
        local_470 = AddMessage(this,number,'\v',(extension->field_3).message_prototype,
                               extension->descriptor);
      }
      bVar1 = WireFormatLite::ReadMessage((CodedInputStream *)field_skipper_local,local_470);
      if (!bVar1) {
        return false;
      }
      break;
    case '\f':
      if ((extension->is_repeated & 1U) == 0) {
        local_460 = MutableString_abi_cxx11_(this,number,'\f',extension->descriptor);
      }
      else {
        local_460 = AddString_abi_cxx11_(this,number,'\f',extension->descriptor);
      }
      bVar1 = WireFormatLite::ReadBytes((CodedInputStream *)field_skipper_local,local_460);
      if (!bVar1) {
        return false;
      }
      break;
    case '\r':
      local_248 = (uint32 *)((long)&value_17 + 4);
      local_240 = input;
      bVar1 = io::CodedInputStream::ReadVarint32(input,local_248);
      if (!bVar1) {
        return false;
      }
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetUInt32(this,extension_local._4_4_,'\r',value_17._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\r',false,value_17._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x0e':
      ppsStack_38 = &value_28;
      local_30 = input;
      local_25 = io::CodedInputStream::ReadVarint32(input,&local_3c);
      if (!(bool)local_25) {
        return false;
      }
      *(uint32 *)ppsStack_38 = local_3c;
      uVar5 = (*(code *)input_local->buffer_)(input_local->buffer_end_,(uint)value_28);
      if ((uVar5 & 1) == 0) {
        (*_limit->_vptr_FieldSkipper[4])(_limit,(ulong)extension_local._4_4_,(ulong)(uint)value_28);
      }
      else if (((ulong)input_local->input_ & 0x100) == 0) {
        SetEnum(this,extension_local._4_4_,'\x0e',(uint)value_28,
                *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddEnum(this,extension_local._4_4_,'\x0e',false,(uint)value_28,
                *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x0f':
      puStack_148 = (uint32 *)((long)&value_23 + 4);
      local_140 = input;
      local_135 = io::CodedInputStream::ReadLittleEndian32(input,&local_14c);
      if (!(bool)local_135) {
        return false;
      }
      *puStack_148 = local_14c;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt32(this,extension_local._4_4_,'\x0f',value_23._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x0f',false,value_23._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x10':
      temp_15 = (uint64)&stack0xfffffffffffffc10;
      local_108 = input;
      local_f9 = io::CodedInputStream::ReadLittleEndian64(input,&local_118);
      if (!(bool)local_f9) {
        return false;
      }
      *(uint64 *)temp_15 = local_118;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt64(this,extension_local._4_4_,'\x10',iStack_3f0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x10',false,iStack_3f0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x11':
      piStack_200 = (int32 *)((long)&value_19 + 4);
      local_1f8 = input;
      local_1ed = io::CodedInputStream::ReadVarint32(input,&local_204);
      if (!(bool)local_1ed) {
        return false;
      }
      iVar2 = WireFormatLite::ZigZagDecode32(local_204);
      *piStack_200 = iVar2;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt32(this,extension_local._4_4_,'\x11',value_19._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x11',false,value_19._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case '\x12':
      temp_13 = (uint64)&stack0xfffffffffffffc30;
      local_1c0 = input;
      local_1b1 = io::CodedInputStream::ReadVarint64(input,&local_1d0);
      if (!(bool)local_1b1) {
        return false;
      }
      iVar4 = WireFormatLite::ZigZagDecode64(local_1d0);
      *(int64 *)temp_13 = iVar4;
      if (((ulong)input_local->input_ & 0x100) == 0) {
        SetInt64(this,extension_local._4_4_,'\x12',iStack_3d0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x12',false,iStack_3d0,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
    }
  }
  else {
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
    if (!bVar1) {
      return false;
    }
    local_2f0 = io::CodedInputStream::PushLimit((CodedInputStream *)field_skipper_local,value);
    switch(*(undefined1 *)&input_local->input_) {
    case 1:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_78 = field_skipper_local;
        temp_7 = (uint64)&value_13;
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          ((CodedInputStream *)field_skipper_local,&local_88);
        if (!bVar1) {
          return false;
        }
        dVar7 = WireFormatLite::DecodeDouble(local_88);
        *(double *)temp_7 = dVar7;
        local_6d = bVar1;
        AddDouble(this,extension_local._4_4_,'\x01',true,_value_13,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 2:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_b8 = field_skipper_local;
        pfStack_c0 = (float *)((long)&value_11 + 4);
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          ((CodedInputStream *)field_skipper_local,&local_c4);
        if (!bVar1) {
          return false;
        }
        fVar6 = WireFormatLite::DecodeFloat(local_c4);
        *pfStack_c0 = fVar6;
        local_a9 = bVar1;
        AddFloat(this,extension_local._4_4_,'\x02',true,value_11._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 3:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_258 = field_skipper_local;
        temp_1 = (uint64)&stack0xfffffffffffffd00;
        local_249 = io::CodedInputStream::ReadVarint64
                              ((CodedInputStream *)field_skipper_local,&local_268);
        if (!(bool)local_249) {
          return false;
        }
        *(uint64 *)temp_1 = local_268;
        AddInt64(this,extension_local._4_4_,'\x03',true,iStack_300,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 4:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_210 = field_skipper_local;
        local_218 = &stack0xfffffffffffffcf0;
        bVar1 = io::CodedInputStream::ReadVarint64
                          ((CodedInputStream *)field_skipper_local,local_218);
        if (!bVar1) {
          return false;
        }
        AddUInt64(this,extension_local._4_4_,'\x04',true,uStack_310,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 5:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_298 = field_skipper_local;
        puStack_2a0 = (uint32 *)((long)&value_1 + 4);
        local_289 = io::CodedInputStream::ReadVarint32
                              ((CodedInputStream *)field_skipper_local,&local_2a4);
        if (!(bool)local_289) {
          return false;
        }
        *puStack_2a0 = local_2a4;
        AddInt32(this,extension_local._4_4_,'\x05',true,value_1._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 6:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_158 = field_skipper_local;
        local_160 = &stack0xfffffffffffffcd0;
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          ((CodedInputStream *)field_skipper_local,local_160);
        if (!bVar1) {
          return false;
        }
        AddUInt64(this,extension_local._4_4_,'\x06',true,uStack_330,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 7:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_178 = field_skipper_local;
        local_180 = (uint32 *)((long)&value_7 + 4);
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          ((CodedInputStream *)field_skipper_local,local_180);
        if (!bVar1) {
          return false;
        }
        AddUInt32(this,extension_local._4_4_,'\a',true,value_7._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 8:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_48 = field_skipper_local;
        pbStack_50 = &local_351;
        local_3d = io::CodedInputStream::ReadVarint32
                             ((CodedInputStream *)field_skipper_local,&local_54);
        if (!(bool)local_3d) {
          return false;
        }
        *pbStack_50 = local_54 != 0;
        AddBool(this,extension_local._4_4_,'\b',true,(bool)(local_351 & 1),
                *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                (&local_390,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3ae);
      other = LogMessage::operator<<(&local_390,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_39d,other);
      LogMessage::~LogMessage(&local_390);
      break;
    case 0xd:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_230 = field_skipper_local;
        local_238 = (uint32 *)((long)&value_3 + 4);
        bVar1 = io::CodedInputStream::ReadVarint32
                          ((CodedInputStream *)field_skipper_local,local_238);
        if (!bVar1) {
          return false;
        }
        AddUInt32(this,extension_local._4_4_,'\r',true,value_3._4_4_,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 0xe:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_18 = field_skipper_local;
        puStack_20 = &local_358;
        local_9 = io::CodedInputStream::ReadVarint32
                            ((CodedInputStream *)field_skipper_local,&local_24);
        if (!(bool)local_9) {
          return false;
        }
        *puStack_20 = local_24;
        uVar5 = (*(code *)input_local->buffer_)(input_local->buffer_end_,local_358);
        if ((uVar5 & 1) != 0) {
          AddEnum(this,extension_local._4_4_,'\x0e',true,local_358,
                  *(FieldDescriptor **)&input_local->total_bytes_read_);
        }
      }
      break;
    case 0xf:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_128 = field_skipper_local;
        puStack_130 = (uint32 *)((long)&value_9 + 4);
        local_119 = io::CodedInputStream::ReadLittleEndian32
                              ((CodedInputStream *)field_skipper_local,&local_134);
        if (!(bool)local_119) {
          return false;
        }
        *puStack_130 = local_134;
        AddInt32(this,extension_local._4_4_,'\x0f',true,value_9._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 0x10:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_e8 = field_skipper_local;
        temp_5 = (uint64)&stack0xfffffffffffffcc0;
        local_dd = io::CodedInputStream::ReadLittleEndian64
                             ((CodedInputStream *)field_skipper_local,&local_f8);
        if (!(bool)local_dd) {
          return false;
        }
        *(uint64 *)temp_5 = local_f8;
        AddInt64(this,extension_local._4_4_,'\x10',true,iStack_340,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 0x11:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_1e0 = field_skipper_local;
        piStack_1e8 = (int32 *)((long)&value_5 + 4);
        bVar1 = io::CodedInputStream::ReadVarint32
                          ((CodedInputStream *)field_skipper_local,&local_1ec);
        if (!bVar1) {
          return false;
        }
        iVar2 = WireFormatLite::ZigZagDecode32(local_1ec);
        *piStack_1e8 = iVar2;
        local_1d1 = bVar1;
        AddInt32(this,extension_local._4_4_,'\x11',true,value_5._4_4_,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
      break;
    case 0x12:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar3) {
        local_1a0 = field_skipper_local;
        temp_3 = (uint64)&stack0xfffffffffffffce0;
        bVar1 = io::CodedInputStream::ReadVarint64
                          ((CodedInputStream *)field_skipper_local,&local_1b0);
        if (!bVar1) {
          return false;
        }
        iVar4 = WireFormatLite::ZigZagDecode64(local_1b0);
        *(int64 *)temp_3 = iVar4;
        local_191 = bVar1;
        AddInt64(this,extension_local._4_4_,'\x12',true,iStack_320,
                 *(FieldDescriptor **)&input_local->total_bytes_read_);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)field_skipper_local,local_2f0);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(
    int number, const ExtensionInfo& extension,
    io::CodedInputStream* input,
    FieldSkipper* field_skipper) {
  if (extension.is_packed) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)        \
      case WireFormatLite::TYPE_##UPPERCASE:                                   \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPP_LOWERCASE value;                                                 \
          if (!WireFormatLite::ReadPrimitive<                                  \
                  CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(            \
                input, &value)) return false;                                  \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             true, value, extension.descriptor);               \
        }                                                                      \
        break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, true, value,
                    extension.descriptor);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                   \
      case WireFormatLite::TYPE_##UPPERCASE: {                                 \
        CPP_LOWERCASE value;                                                   \
        if (!WireFormatLite::ReadPrimitive<                                    \
                CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(              \
               input, &value)) return false;                                   \
        if (extension.is_repeated) {                                          \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             false, value, extension.descriptor);              \
        } else {                                                               \
          Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,  \
                             extension.descriptor);                            \
        }                                                                      \
      } break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, false, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_STRING, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_STRING,
                        extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_BYTES, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_BYTES,
                        extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_GROUP,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_GROUP,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}